

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

void sysbvm_integer_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  ulong immediateTypeTag;
  
  sVar2 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_integer_primitive_printString);
  sysbvm_type_setPrintStringFunction(context,(context->roots).integerType,sVar2);
  sysbvm_type_setPrintStringFunction(context,(context->roots).largePositiveIntegerType,sVar2);
  sysbvm_type_setPrintStringFunction(context,(context->roots).largeNegativeIntegerType,sVar2);
  psVar1 = (sysbvm_tuple_t *)(context->roots).integerType;
  immediateTypeTag = (ulong)psVar1 & 0xf;
  if (immediateTypeTag == 0 && psVar1 != (sysbvm_tuple_t *)0x0) {
    sVar2 = *psVar1;
  }
  else if ((int)immediateTypeTag == 0xf) {
    sVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar1 >> 4);
  }
  else {
    sVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,sVar2,"parseString:",2,0x1c,(void *)0x0,sysbvm_integer_primitive_parseString);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"+",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_add);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"-",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_subtract);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"negated",1,0x1c,(void *)0x0,
             sysbvm_integer_primitive_negated);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"*",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_multiply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"//",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_divide);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"%",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_remainder);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"<=>",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_compare);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"=",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"~=",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_notEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"<",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_lessThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"<=",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_lessEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,">",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_greaterThan);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,">=",2,0x1c,(void *)0x0,
             sysbvm_integer_primitive_greaterEquals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"factorial",1,0x1c,(void *)0x0,
             sysbvm_integer_primitive_factorial);
  return;
}

Assistant:

void sysbvm_integer_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_tuple_t printString = sysbvm_function_createPrimitive(context, 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_printString);
    sysbvm_type_setPrintStringFunction(context, context->roots.integerType, printString);
    sysbvm_type_setPrintStringFunction(context, context->roots.largePositiveIntegerType, printString);
    sysbvm_type_setPrintStringFunction(context, context->roots.largeNegativeIntegerType, printString);
    
    sysbvm_context_setIntrinsicPrimitiveMethod(context, sysbvm_tuple_getType(context, context->roots.integerType), "parseString:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_parseString);
    
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "+", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_add);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "-", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_subtract);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "negated", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_negated);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "*", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_multiply);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "//", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_divide);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "%", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_remainder);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "<=>", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_compare);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "=", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_equals);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "~=", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_notEquals);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "<", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_lessThan);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "<=", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_lessEquals);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, ">", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_greaterThan);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, ">=", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_greaterEquals);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "factorial", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_integer_primitive_factorial);
}